

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::ValidateSignature
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aSignature,
          Message *aSignedMessage)

{
  ErrorCode EVar1;
  Error *pEVar2;
  char *begin;
  char *pcVar3;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_108 [8];
  string local_100;
  parse_func local_e0 [1];
  Sign1Message sign1Msg;
  ByteArray rawPublicKeyInToken;
  ByteArray externalData;
  string local_88;
  CborMap publicKeyInToken;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cose::Sign1Message::Sign1Message(&sign1Msg);
  rawPublicKeyInToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rawPublicKeyInToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rawPublicKeyInToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CborMap::CborMap(&publicKeyInToken);
  if ((aSignature->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aSignature->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_108._0_4_ = none_type;
    local_100._M_dataplus._M_p = "the signature is empty";
    local_100._M_string_length = 0x16;
    local_100.field_2._M_allocated_capacity = 0;
    local_e0[0] = (parse_func)0x0;
    pcVar3 = "the signature is empty";
    local_100.field_2._8_8_ = local_108;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_108);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)"the signature is empty",(string_view)ZEXT816(0x16),args);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_88);
    Error::operator=(__return_storage_ptr__,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    this_00 = &local_88;
  }
  else {
    cose::Sign1Message::Deserialize((Error *)local_108,&sign1Msg,aSignature);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    PrepareSigningContent((Error *)local_108,&externalData,aSignedMessage);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    cose::Sign1Message::SetExternalData((Error *)local_108,&sign1Msg,&externalData);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    cose::Sign1Message::Validate
              ((Error *)local_108,&sign1Msg,(mbedtls_pk_context_conflict *)&this->mPublicKey);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    GetPublicKeyInToken((Error *)local_108,this,&rawPublicKeyInToken);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    CborValue::Deserialize
              ((Error *)local_108,&publicKeyInToken.super_CborValue,
               rawPublicKeyInToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (long)rawPublicKeyInToken.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)rawPublicKeyInToken.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_108);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_108 + 8));
    if (EVar1 != kNone) goto LAB_001798ae;
    cose::Sign1Message::Validate((Error *)local_108,&sign1Msg,&publicKeyInToken);
    Error::operator=(__return_storage_ptr__,(Error *)local_108);
    this_00 = (string *)(local_108 + 8);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001798ae:
  cose::Sign1Message::Free(&sign1Msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&rawPublicKeyInToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&externalData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::ValidateSignature(const ByteArray &aSignature, const coap::Message &aSignedMessage)
{
    Error              error;
    ByteArray          externalData;
    cose::Sign1Message sign1Msg;
    ByteArray          rawPublicKeyInToken;
    CborMap            publicKeyInToken;

    VerifyOrExit(!aSignature.empty(), error = ERROR_INVALID_ARGS("the signature is empty"));
    SuccessOrExit(error = cose::Sign1Message::Deserialize(sign1Msg, aSignature));

    SuccessOrExit(error = PrepareSigningContent(externalData, aSignedMessage));
    SuccessOrExit(error = sign1Msg.SetExternalData(externalData));
    SuccessOrExit(error = sign1Msg.Validate(mPublicKey));
    SuccessOrExit(error = GetPublicKeyInToken(rawPublicKeyInToken));
    SuccessOrExit(error =
                      CborValue::Deserialize(publicKeyInToken, rawPublicKeyInToken.data(), rawPublicKeyInToken.size()));
    SuccessOrExit(error = sign1Msg.Validate(publicKeyInToken));

exit:
    sign1Msg.Free();
    return error;
}